

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::SlicePlane(SlicePlane *this,string *name_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  mat<4,_4,_float,_(glm::qualifier)0> value_;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  Engine *this_00;
  char cVar8;
  char cVar9;
  long *plVar10;
  mapped_type *pmVar11;
  size_type *psVar12;
  ulong uVar13;
  ulong __val;
  vec3 value__00;
  vec<3,_float,_(glm::qualifier)0> value__01;
  string local_1e0;
  string local_1c0;
  TransformationGizmo *local_1a0;
  string *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  string *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar6 [40];
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar3,pcVar3 + name_->_M_string_length);
  local_180 = &this->postfix;
  cVar9 = '\x01';
  __val = DAT_005f9d30 - state::slicePlanes >> 3;
  if (9 < __val) {
    uVar13 = __val;
    cVar8 = '\x04';
    do {
      cVar9 = cVar8;
      if (uVar13 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00237b0e;
      }
      if (uVar13 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00237b0e;
      }
      if (uVar13 < 10000) goto LAB_00237b0e;
      bVar4 = 99999 < uVar13;
      uVar13 = uVar13 / 10000;
      cVar8 = cVar9 + '\x04';
    } while (bVar4);
    cVar9 = cVar9 + '\x01';
  }
LAB_00237b0e:
  paVar2 = &(this->postfix).field_2;
  (this->postfix)._M_dataplus._M_p = (pointer)paVar2;
  local_178 = paVar1;
  std::__cxx11::string::_M_construct((ulong)local_180,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((this->postfix)._M_dataplus._M_p,(uint)(this->postfix)._M_string_length,__val);
  local_188 = paVar2;
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  paVar1 = &local_1e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->active,&local_1e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  paVar2 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->drawPlane,&local_1e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  PersistentValue<bool>::PersistentValue(&this->drawWidget,&local_1e0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_70 = 0x3f800000;
  uStack_6c = 0;
  uStack_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0x3f800000;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0x3f800000;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_34 = 0x3f800000;
  auVar6 = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  value_.value[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3f800000;
  value_.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  auVar5 = auVar6._0_16_;
  auVar7 = auVar6._16_16_;
  value_.value[0].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar5._0_4_;
  value_.value[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar5._4_4_;
  value_.value[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar5._8_4_;
  value_.value[0].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar5._12_4_;
  value_.value[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar7._0_4_;
  value_.value[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar7._4_4_;
  value_.value[1].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)auVar7._8_4_;
  value_.value[1].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)auVar7._12_4_;
  value_.value[2].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)auVar6._32_4_;
  value_.value[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)auVar6._36_4_;
  value_.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  value_.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  value_.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  value_.value[3].field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->objectTransform,&local_1e0,value_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  value__00 = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_1e0,value__00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  value__01.field_2.z = 0.97;
  value__01.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f7851ec;
  value__01.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f7851ec;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->gridLineColor,&local_1e0,value__01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  PersistentValue<float>::PersistentValue(&this->transparency,&local_1e0,0.5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  local_190 = &(this->inspectedMeshName).field_2;
  this->shouldInspectMesh = false;
  (this->inspectedMeshName)._M_dataplus._M_p = (pointer)local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->inspectedMeshName,"");
  (this->volumeInspectProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->volumeInspectProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_198 = &this->inspectedMeshName;
  uniquePrefix_abi_cxx11_(&local_1e0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_1a0 = &this->transformGizmo;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_110.field_2._M_allocated_capacity = *psVar12;
    local_110.field_2._8_8_ = plVar10[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar12;
    local_110._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_110._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  TransformationGizmo::TransformationGizmo
            (local_1a0,&local_110,&(this->objectTransform).value,&this->objectTransform);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[3].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[0].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[1].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceBufferDataArr)._M_elems[2].
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uniquePrefix_abi_cxx11_(&local_1c0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0.field_2._8_8_ = plVar10[3];
    local_1e0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = *psVar12;
    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_1e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&this->sliceBufferArr,(ManagedBufferRegistry *)0x0,
             &local_1e0,(this->sliceBufferDataArr)._M_elems);
  uniquePrefix_abi_cxx11_(&local_90,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_130.field_2._M_allocated_capacity = *psVar12;
    local_130.field_2._8_8_ = plVar10[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar12;
    local_130._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_130._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0xe8,
             (ManagedBufferRegistry *)0x0,&local_130,(this->sliceBufferDataArr)._M_elems + 1);
  uniquePrefix_abi_cxx11_(&local_b0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_150.field_2._M_allocated_capacity = *psVar12;
    local_150.field_2._8_8_ = plVar10[3];
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  }
  else {
    local_150.field_2._M_allocated_capacity = *psVar12;
    local_150._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_150._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0x1d0,
             (ManagedBufferRegistry *)0x0,&local_150,(this->sliceBufferDataArr)._M_elems + 2);
  uniquePrefix_abi_cxx11_(&local_d0,this);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_170.field_2._M_allocated_capacity = *psVar12;
    local_170.field_2._8_8_ = plVar10[3];
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  }
  else {
    local_170.field_2._M_allocated_capacity = *psVar12;
    local_170._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_170._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            ((ManagedBuffer<unsigned_int> *)&(this->sliceBufferArr).field_0x2b8,
             (ManagedBufferRegistry *)0x0,&local_170,(this->sliceBufferDataArr)._M_elems + 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->planeProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = render::engine;
  pcVar3 = (this->postfix)._M_dataplus._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,pcVar3 + (this->postfix)._M_string_length);
  render::Engine::addSlicePlane(this_00,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (this->transformGizmo).enabled.value = true;
  pmVar11 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&detail::persistentCache_bool,&(this->transformGizmo).enabled.name);
  *pmVar11 = true;
  (this->transformGizmo).enabled.holdsDefaultValue = false;
  prepare(this);
  return;
}

Assistant:

SlicePlane::SlicePlane(std::string name_)
    : name(name_), postfix(std::to_string(state::slicePlanes.size())), active(uniquePrefix() + "#active", true),
      drawPlane(uniquePrefix() + "#drawPlane", true), drawWidget(uniquePrefix() + "#drawWidget", true),
      objectTransform(uniquePrefix() + "#object_transform", glm::mat4(1.0)),
      color(uniquePrefix() + "#color", getNextUniqueColor()),
      gridLineColor(uniquePrefix() + "#gridLineColor", glm::vec3{.97, .97, .97}),
      transparency(uniquePrefix() + "#transparency", 0.5), shouldInspectMesh(false), inspectedMeshName(""),
      transformGizmo(uniquePrefix() + "#transformGizmo", objectTransform.get(), &objectTransform),
      sliceBufferArr{{{nullptr, uniquePrefix() + "#slice1", sliceBufferDataArr[0]},
                      {nullptr, uniquePrefix() + "#slice2", sliceBufferDataArr[1]},
                      {nullptr, uniquePrefix() + "#slice3", sliceBufferDataArr[2]},
                      {nullptr, uniquePrefix() + "#slice4", sliceBufferDataArr[3]}}}

{
  render::engine->addSlicePlane(postfix);
  transformGizmo.enabled = true;
  prepare();
}